

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O0

void updateFormLayoutItem
               (QFormLayoutItem *item,int userVSpacing,FieldGrowthPolicy fieldGrowthPolicy,
               bool fullRow)

{
  byte bVar1;
  undefined1 uVar2;
  int w;
  byte in_CL;
  int in_EDX;
  undefined4 in_ESI;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  undefined8 in_stack_ffffffffffffffb8;
  Orientation other;
  undefined4 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc4;
  undefined1 in_stack_ffffffffffffffc5;
  undefined1 uVar3;
  undefined1 uVar4;
  QFlagsStorageHelper<Qt::Orientation,_4> local_24;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  other = (Orientation)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = in_CL & 1;
  local_10 = (**(code **)(*(long *)*in_RDI + 0x18))();
  *(undefined8 *)((long)in_RDI + 0xc) = local_10;
  local_18 = (**(code **)(*(long *)*in_RDI + 0x10))();
  *(undefined8 *)((long)in_RDI + 0x14) = local_18;
  local_20 = (**(code **)(*(long *)*in_RDI + 0x20))();
  *(undefined8 *)((long)in_RDI + 0x1c) = local_20;
  uVar4 = false;
  uVar2 = uVar4;
  if ((((bVar1 & 1) == 0) &&
      (uVar3 = true, in_stack_ffffffffffffffc5 = uVar3, uVar2 = uVar3, in_EDX != 0)) &&
     (in_stack_ffffffffffffffc4 = false, in_stack_ffffffffffffffc5 = in_stack_ffffffffffffffc4,
     uVar2 = in_stack_ffffffffffffffc4, in_EDX == 1)) {
    (**(code **)(*(long *)*in_RDI + 0x28))();
    local_24.super_QFlagsStorage<Qt::Orientation>.i =
         (QFlagsStorage<Qt::Orientation>)
         QFlags<Qt::Orientation>::operator&
                   ((QFlags<Qt::Orientation> *)
                    CONCAT17(bVar1,CONCAT16(uVar4,CONCAT15(uVar3,CONCAT14(in_stack_ffffffffffffffc4,
                                                                          in_stack_ffffffffffffffc0)
                                                          ))),other);
    in_stack_ffffffffffffffc4 =
         QFlags<Qt::Orientation>::operator!((QFlags<Qt::Orientation> *)&local_24);
    in_stack_ffffffffffffffc5 = in_stack_ffffffffffffffc4;
    uVar2 = in_stack_ffffffffffffffc4;
  }
  if ((bool)uVar2 != false) {
    w = (int)((ulong)((long)in_RDI + 0x1c) >> 0x20);
    QSize::width((QSize *)0x4b3289);
    QSize::setWidth((QSize *)CONCAT17(bVar1,CONCAT16(uVar2,CONCAT15(in_stack_ffffffffffffffc5,
                                                                    CONCAT14(
                                                  in_stack_ffffffffffffffc4,
                                                  in_stack_ffffffffffffffc0)))),w);
  }
  uVar2 = (**(code **)(*(long *)*in_RDI + 0x48))();
  *(undefined1 *)((long)in_RDI + 10) = uVar2;
  *(undefined4 *)(in_RDI + 5) = in_ESI;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void updateFormLayoutItem(QFormLayoutItem *item, int userVSpacing,
                                        QFormLayout::FieldGrowthPolicy fieldGrowthPolicy,
                                        bool fullRow)
{
    item->minSize = item->item->minimumSize();
    item->sizeHint = item->item->sizeHint();
    item->maxSize = item->item->maximumSize();

    if (!fullRow && (fieldGrowthPolicy == QFormLayout::FieldsStayAtSizeHint
                     || (fieldGrowthPolicy == QFormLayout::ExpandingFieldsGrow
                         && !(item->item->expandingDirections() & Qt::Horizontal))))
        item->maxSize.setWidth(item->sizeHint.width());

    item->isHfw = item->item->hasHeightForWidth();
    item->vSpace = userVSpacing;
}